

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          Descriptor *desc)

{
  bool bVar1;
  allocator local_55 [20];
  byte local_41;
  string local_40;
  GeneratorOptions *local_20;
  Descriptor *desc_local;
  GeneratorOptions *options_local;
  
  local_20 = options;
  desc_local = (Descriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  bVar1 = anon_unknown_0::HasOneofFields((Descriptor *)options);
  local_41 = 0;
  if (bVar1) {
    GetMessagePath_abi_cxx11_(&local_40,(_anonymous_namespace_ *)desc_local,local_20,desc);
    local_41 = 1;
    std::operator+(__return_storage_ptr__,&local_40,kOneofGroupArrayName);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",local_55);
    std::allocator<char>::~allocator((allocator<char> *)local_55);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OneofFieldsArrayName(const GeneratorOptions& options,
                                 const Descriptor* desc) {
  return HasOneofFields(desc)
             ? (GetMessagePath(options, desc) + kOneofGroupArrayName)
             : "null";
}